

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

bool google::FindSymbol(uint64_t pc,int fd,char *out,int out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  long lVar6;
  ssize_t sVar7;
  void *pvVar8;
  Elf64_Xword *pEVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  byte bVar13;
  Elf64_Sym buf [32];
  
  pEVar9 = (Elf64_Xword *)(ulong)(uint)out_size;
  uVar11 = 0;
  if (symtab != (Elf64_Shdr *)0x0) {
    uVar1 = symtab->sh_size;
    uVar2 = symtab->sh_entsize;
    while( true ) {
      bVar13 = (byte)pEVar9;
      iVar4 = (int)(uVar1 / uVar2);
      iVar10 = iVar4 - uVar11;
      if (iVar10 == 0 || iVar4 < (int)uVar11) break;
      if (0x1f < iVar10) {
        iVar10 = 0x20;
      }
      uVar5 = ReadFromOffset(fd,buf,(long)iVar10 * 0x18,
                             (long)(int)uVar11 * symtab->sh_entsize + symtab->sh_offset);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar5;
      lVar6 = SUB168(auVar3 / ZEXT816(0x18),0);
      if ((uVar5 % 0x18 != 0) || (pEVar9 = &buf[0].st_size, iVar10 < lVar6)) {
        abort();
      }
      while (bVar12 = lVar6 != 0, lVar6 = lVar6 + -1, bVar12) {
        if ((((pEVar9[-1] != 0) && (uVar5 = pEVar9[-1] + symbol_offset, uVar5 <= pc)) &&
            (*(Elf64_Section *)((long)pEVar9 + -10) != 0)) && (pc < uVar5 + *pEVar9)) {
          sVar7 = ReadFromOffset(fd,out,(long)out_size,
                                 (ulong)((Elf64_Sym *)(pEVar9 + -2))->st_name + strtab->sh_offset);
          if (sVar7 < 1) {
            bVar13 = 0;
          }
          else {
            pvVar8 = memchr(out,0,(long)out_size);
            bVar13 = pvVar8 != (void *)0x0;
          }
          goto LAB_00122a34;
        }
        pEVar9 = pEVar9 + 3;
      }
      uVar11 = uVar11 + SUB164(auVar3 / ZEXT816(0x18),0);
    }
LAB_00122a34:
    uVar11 = (uint)((int)uVar11 < iVar4 & bVar13);
  }
  return SUB41(uVar11,0);
}

Assistant:

static ATTRIBUTE_NOINLINE bool
FindSymbol(uint64_t pc, const int fd, char *out, int out_size,
           uint64_t symbol_offset, const ElfW(Shdr) *strtab,
           const ElfW(Shdr) *symtab) {
  if (symtab == NULL) {
    return false;
  }
  const int num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (int i = 0; i < num_symbols;) {
    off_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#if __WORDSIZE == 64
#define NUM_SYMBOLS 32
#else
#define NUM_SYMBOLS 64
#endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    int num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_symbols_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (int j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == NULL) {
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}